

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.cpp
# Opt level: O3

bool attack(MonsterThing *mp)

{
  ItemThing *obj;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  long lVar8;
  _List_node_base *p_Var9;
  char cVar10;
  ItemThing *local_40;
  
  iVar4 = player.flags;
  running = false;
  count = 0;
  quiet = 0;
  if ((to_death) && ((mp->flags & 0x80) == 0)) {
    to_death = false;
    kamikaze = false;
  }
  if ((((mp->type == 'X') && (mp->disguise != 'X')) && ((player.flags & 4U) == 0)) &&
     (mp->disguise = 'X', ((uint)iVar4 >> 0xb & 1) != 0)) {
    iVar4 = (mp->pos).x;
    iVar3 = (mp->pos).y;
    iVar2 = rnd(0x1a);
    setMapDisplay(iVar4,iVar3,iVar2 + 0x41);
  }
  pcVar7 = set_mname(mp);
  iVar4 = player.stats.s_hpt;
  bVar1 = roll_em(mp,&player,(ItemThing *)0x0,false);
  cVar10 = mp->type;
  if (!bVar1) {
    if (cVar10 != 'I') {
      if (has_hit == true) {
        addmsg(".  ");
        has_hit = false;
        cVar10 = mp->type;
      }
      if ((cVar10 == 'F') &&
         (iVar4 = player.stats.s_hpt - vf_hit, bVar1 = player.stats.s_hpt < vf_hit,
         player.stats.s_hpt = iVar4, iVar4 == 0 || bVar1)) {
        death('F');
      }
      miss(pcVar7,(char *)0x0,false);
    }
    goto switchD_0011e097_caseD_4a;
  }
  if (cVar10 == 'I') {
    if (has_hit != false) {
      endmsg();
    }
  }
  else {
    if (has_hit != false) {
      addmsg(".  ");
    }
    hit(pcVar7,(char *)0x0,false);
  }
  has_hit = false;
  if (player.stats.s_hpt < 1) {
    death(mp->type);
  }
  else if (kamikaze == false) {
    if (max_hit < iVar4 - player.stats.s_hpt) {
      max_hit = iVar4 - player.stats.s_hpt;
    }
    if (player.stats.s_hpt <= max_hit) {
      to_death = false;
    }
  }
  iVar4 = purse;
  if ((mp->flags & 0x10000) != 0) goto switchD_0011e097_caseD_4a;
  cVar10 = mp->type;
  switch(cVar10) {
  case 'I':
    player.flags = player.flags & 0xffffdfff;
    if (no_command == 0) {
      addmsg("you are frozen");
      if (terse == false) {
        addmsg(" by the %s",pcVar7);
      }
      endmsg();
    }
    iVar4 = rnd(2);
    no_command = iVar4 + no_command + 2;
    if (no_command < 0x33) break;
    cVar10 = 'h';
    goto LAB_0011e224;
  case 'J':
  case 'K':
  case 'M':
  case 'O':
  case 'P':
  case 'Q':
  case 'S':
  case 'T':
  case 'U':
    break;
  case 'L':
    iVar3 = rnd(level * 10 + 0x32);
    purse = (purse - iVar3) + -2;
    iVar3 = save(3);
    if (iVar3 == 0) {
      iVar3 = rnd(level * 10 + 0x32);
      iVar2 = rnd(level * 10 + 0x32);
      iVar5 = rnd(level * 10 + 0x32);
      iVar6 = rnd(level * 10 + 0x32);
      purse = (purse - (iVar6 + iVar5 + iVar2 + iVar3)) + -8;
    }
    if (purse < 0) {
      purse = 0;
    }
    remove_mon(&mp->pos,mp,false);
    if (purse != iVar4) {
      msg("your purse feels lighter");
    }
    mp = (MonsterThing *)0x0;
    break;
  case 'N':
    if (player.pack.super__List_base<ItemThing_*,_std::allocator<ItemThing_*>_>._M_impl._M_node.
        super__List_node_base._M_next != (_List_node_base *)&player.pack) {
      iVar4 = 0;
      local_40 = (ItemThing *)0x0;
      p_Var9 = player.pack.super__List_base<ItemThing_*,_std::allocator<ItemThing_*>_>._M_impl.
               _M_node.super__List_node_base._M_next;
      do {
        obj = (ItemThing *)p_Var9[1]._M_next;
        if ((((obj != cur_armor) && (obj != cur_weapon)) && (obj != cur_ring[0])) &&
           ((obj != cur_ring[1] && (bVar1 = is_magic(obj), bVar1)))) {
          iVar4 = iVar4 + 1;
          iVar3 = rnd(iVar4);
          if (iVar3 == 0) {
            local_40 = obj;
          }
        }
        p_Var9 = p_Var9->_M_next;
      } while (p_Var9 != (_List_node_base *)&player.pack);
      if (local_40 != (ItemThing *)0x0) {
        remove_mon(&mp->pos,places[(long)((mp->pos).x << 5) + (long)(mp->pos).y].p_monst,false);
        leave_pack(local_40,false,false);
        pcVar7 = inv_name(local_40,true);
        msg("she stole %s!",pcVar7);
        operator_delete(local_40);
        mp = (MonsterThing *)0x0;
      }
    }
    break;
  case 'R':
    iVar4 = save(0);
    if (iVar4 != 0) break;
    if (((cur_ring[0] == (ItemThing *)0x0) || (cur_ring[0]->which != 2)) &&
       ((cur_ring[1] == (ItemThing *)0x0 || (cur_ring[1]->which != 2)))) {
      chg_str(-1);
      if (terse == false) {
        pcVar7 = "you feel a bite in your leg and now feel weaker";
      }
      else {
        pcVar7 = "a bite has weakened you";
      }
    }
    else {
      if (to_death != false) break;
      if (terse == false) {
        pcVar7 = "a bite momentarily weakens you";
      }
      else {
        pcVar7 = "bite has no effect";
      }
    }
    goto LAB_0011e48e;
  case 'V':
  case 'W':
    iVar3 = rnd(100);
    iVar4 = 0x1e;
    if (mp->type == 'W') {
      iVar4 = 0xf;
    }
    if (iVar4 <= iVar3) break;
    iVar4 = 3;
    if (mp->type == 'W') {
      if (player.stats.s_exp == 0) {
        death('W');
      }
      lVar8 = (long)player.stats.s_lvl;
      player.stats.s_lvl = player.stats.s_lvl + -1;
      if (player.stats.s_lvl == 0) {
        player.stats.s_lvl = 1;
        player.stats.s_exp = 0;
      }
      else {
        player.stats.s_exp = *(int *)(&DAT_0015ef18 + lVar8 * 4) + 1;
      }
      iVar4 = 10;
    }
    iVar3 = roll(1,iVar4);
    player.stats.s_maxhp = player.stats.s_maxhp - iVar3;
    iVar4 = player.stats.s_hpt - iVar3;
    bVar1 = player.stats.s_hpt < iVar3;
    player.stats.s_hpt = iVar4;
    if (iVar4 == 0 || bVar1) {
      player.stats.s_hpt = 1;
    }
    if (player.stats.s_maxhp < 1) {
      death(mp->type);
    }
    pcVar7 = "you suddenly feel weaker";
LAB_0011e48e:
    msg(pcVar7);
    break;
  default:
    if (cVar10 == 'A') {
      rust_armor(cur_armor);
      break;
    }
    if (cVar10 != 'F') break;
    player.flags = player.flags | 0x100;
    vf_hit = vf_hit + 1;
    sprintf(monsters[5].m_stats.s_dmg,"%dx1");
    iVar4 = player.stats.s_hpt + -1;
    bVar1 = 1 < player.stats.s_hpt;
    player.stats.s_hpt = iVar4;
    if (bVar1) break;
    cVar10 = 'F';
LAB_0011e224:
    death(cVar10);
  }
switchD_0011e097_caseD_4a:
  if ((fight_flush == true) && (to_death == false)) {
    flush_type();
  }
  count = 0;
  status(false);
  return mp == (MonsterThing *)0x0;
}

Assistant:

bool attack(MonsterThing *mp)
{
    const char *mname;
    int oldhp;

    /*
     * Since this is an attack, stop running and any healing that was
     * going on at the time.
     */
    running = false;
    count = 0;
    quiet = 0;
    if (to_death && !on(*mp, ISTARGET))
    {
        to_death = false;
        kamikaze = false;
    }
    if (mp->type == 'X' && mp->disguise != 'X' && !on(player, ISBLIND))
    {
        mp->disguise = 'X';
        if (on(player, ISHALU))
            setMapDisplay(mp->pos.x, mp->pos.y, rnd(26) + 'A');
    }
    mname = set_mname(mp);
    oldhp = player.stats.s_hpt;
    if (roll_em(mp, &player, nullptr, false))
    {
        if (mp->type != 'I')
        {
            if (has_hit)
                addmsg(".  ");
            hit(mname, nullptr, false);
        }
        else
            if (has_hit)
                endmsg();
        has_hit = false;
        if (player.stats.s_hpt <= 0)
            death(mp->type);        /* Bye bye life ... */
        else if (!kamikaze)
        {
            oldhp -= player.stats.s_hpt;
            if (oldhp > max_hit)
                max_hit = oldhp;
            if (player.stats.s_hpt <= max_hit)
                to_death = false;
        }
        if (!on(*mp, ISCANC))
            switch (mp->type)
            {
                case 'A':
                    /*
                     * If an aquator hits, you can lose armor class.
                     */
                    rust_armor(cur_armor);
                when 'I':
                    /*
                     * The ice monster freezes you
                     */
                    player.flags &= ~ISRUN;
                    if (!no_command)
                    {
                        addmsg("you are frozen");
                        if (!terse)
                            addmsg(" by the %s", mname);
                        endmsg();
                    }
                    no_command += rnd(2) + 2;
                    if (no_command > BORE_LEVEL)
                        death('h');
                when 'R':
                    /*
                     * Rattlesnakes have poisonous bites
                     */
                    if (!save(VS_POISON))
                    {
                        if (!ISWEARING(R_SUSTSTR))
                        {
                            chg_str(-1);
                            if (!terse)
                                msg("you feel a bite in your leg and now feel weaker");
                            else
                                msg("a bite has weakened you");
                        }
                        else if (!to_death)
                        {
                            if (!terse)
                                msg("a bite momentarily weakens you");
                            else
                                msg("bite has no effect");
                        }
                    }
                when 'W':
                case 'V':
                    /*
                     * Wraiths might drain energy levels, and Vampires
                     * can steal max_hp
                     */
                    if (rnd(100) < (mp->type == 'W' ? 15 : 30))
                    {
                        int fewer;

                        if (mp->type == 'W')
                        {
                            if (player.stats.s_exp == 0)
                                death('W');                /* All levels gone */
                            if (--player.stats.s_lvl == 0)
                            {
                                player.stats.s_exp = 0;
                                player.stats.s_lvl = 1;
                            }
                            else
                                player.stats.s_exp = e_levels[player.stats.s_lvl-1]+1;
                            fewer = roll(1, 10);
                        }
                        else
                            fewer = roll(1, 3);
                        player.stats.s_hpt -= fewer;
                        player.stats.s_maxhp -= fewer;
                        if (player.stats.s_hpt <= 0)
                            player.stats.s_hpt = 1;
                        if (player.stats.s_maxhp <= 0)
                            death(mp->type);
                        msg("you suddenly feel weaker");
                    }
                when 'F':
                    /*
                     * Venus Flytrap stops the poor guy from moving
                     */
                    player.flags |= ISHELD;
                    sprintf(monsters['F'-'A'].m_stats.s_dmg,"%dx1", ++vf_hit);
                    if (--player.stats.s_hpt <= 0)
                        death('F');
                when 'L':
                {
                    /*
                     * Leperachaun steals some gold
                     */
                    int lastpurse;

                    lastpurse = purse;
                    purse -= GOLDCALC;
                    if (!save(VS_MAGIC))
                        purse -= GOLDCALC + GOLDCALC + GOLDCALC + GOLDCALC;
                    if (purse < 0)
                        purse = 0;
                    remove_mon(&mp->pos, mp, false);
                    mp=nullptr;
                    if (purse != lastpurse)
                        msg("your purse feels lighter");
                }
                when 'N':
                {
                    ItemThing *steal;
                    int nobj;

                    /*
                     * Nymph's steal a magic item, look through the pack
                     * and pick out one we like.
                     */
                    steal = nullptr;
                    nobj = 0;
                    for (ItemThing* obj : player.pack)
                        if (obj != cur_armor && obj != cur_weapon && obj != cur_ring[LEFT] && obj != cur_ring[RIGHT] && is_magic(obj) && rnd(++nobj) == 0)
                            steal = obj;
                    if (steal != nullptr)
                    {
                        remove_mon(&mp->pos, monster_at(mp->pos.x, mp->pos.y), false);
                        mp=nullptr;
                        leave_pack(steal, false, false);
                        msg("she stole %s!", inv_name(steal, true));
                        delete steal;
                    }
                }
                otherwise:
                    break;
            }
    }
    else if (mp->type != 'I')
    {
        if (has_hit)
        {
            addmsg(".  ");
            has_hit = false;
        }
        if (mp->type == 'F')
        {
            take_damage(vf_hit, 'F');
        }
        miss(mname, nullptr, false);
    }
    if (fight_flush && !to_death)
        flush_type();
    count = 0;
    status(false);
    if (mp == nullptr)
        return true;
    else
        return false;
}